

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall minja::Value::operator*(Value *__return_storage_ptr__,Value *this,Value *rhs)

{
  value_t vVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  ostringstream out;
  string local_1c0;
  double local_1a0 [47];
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (vVar1 == string) {
    if ((byte)((rhs->primitive_).m_data.m_type - number_integer) < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      lVar2 = get<long>(rhs);
      lVar3 = 0;
      if (0 < lVar2) {
        lVar3 = lVar2;
      }
      while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
        to_str_abi_cxx11_(&local_1c0,this);
        std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      std::__cxx11::stringbuf::str();
      Value(__return_storage_ptr__,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      return __return_storage_ptr__;
    }
  }
  else if (((byte)(vVar1 - number_integer) < 2) &&
          ((byte)((rhs->primitive_).m_data.m_type - number_integer) < 2)) {
    lVar3 = get<long>(this);
    lVar2 = get<long>(rhs);
    local_1a0[0] = (double)(lVar2 * lVar3);
    Value(__return_storage_ptr__,(int64_t *)local_1a0);
    return __return_storage_ptr__;
  }
  dVar5 = get<double>(this);
  local_1a0[0] = get<double>(rhs);
  local_1a0[0] = local_1a0[0] * dVar5;
  Value(__return_storage_ptr__,local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Value operator*(const Value& rhs) const {
      if (is_string() && rhs.is_number_integer()) {
        std::ostringstream out;
        for (int64_t i = 0, n = rhs.get<int64_t>(); i < n; ++i) {
          out << to_str();
        }
        return out.str();
      }
      else if (is_number_integer() && rhs.is_number_integer())
        return get<int64_t>() * rhs.get<int64_t>();
      else
        return get<double>() * rhs.get<double>();
  }